

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O3

qsizetype QtPrivate::lastIndexOf
                    (QStringView haystack,qsizetype from,QStringView needle,CaseSensitivity cs)

{
  char32_t cVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  size_t l;
  QChar *ch;
  QChar *start;
  short sVar5;
  char16_t cVar6;
  ulong uVar7;
  QChar *pQVar8;
  long lVar9;
  char16_t cVar10;
  long lVar11;
  long lVar12;
  QChar *ch_00;
  QChar *pQVar13;
  ulong uVar14;
  
  pQVar8 = (QChar *)needle.m_data;
  lVar4 = needle.m_size;
  start = (QChar *)haystack.m_data;
  uVar7 = haystack.m_size;
  if (lVar4 == 1) {
    if (uVar7 != 0) {
      cVar6 = pQVar8->ucs;
      if (from < 0) {
        lVar4 = from + uVar7;
        if ((long)(from + uVar7) < 0) {
          return -1;
        }
      }
      else {
        lVar4 = from;
        if (uVar7 < (ulong)from) {
          lVar4 = uVar7 - 1;
        }
      }
      if (cs == CaseSensitive) {
        if (-1 < lVar4) {
          lVar4 = lVar4 * 2;
          do {
            if (*(char16_t *)((long)&start->ucs + lVar4) == cVar6) {
LAB_0032803a:
              return lVar4 >> 1;
            }
            pQVar8 = (QChar *)((long)&start[-1].ucs + lVar4);
            lVar4 = lVar4 + -2;
          } while (start <= pQVar8);
        }
      }
      else {
        sVar5 = (short)((uint)(int)(short)*(ushort *)
                                           (QUnicodeTables::uc_properties +
                                           (ulong)*(ushort *)
                                                   (QUnicodeTables::uc_property_trie +
                                                   (ulong)(((ushort)cVar6 & 0x1f) +
                                                          (uint)*(ushort *)
                                                                 (QUnicodeTables::uc_property_trie +
                                                                 (ulong)((ushort)cVar6 >> 5) * 2)) *
                                                   2) * 0x14 + 0xe) >> 1);
        if ((*(ushort *)
              (QUnicodeTables::uc_properties +
              (ulong)*(ushort *)
                      (QUnicodeTables::uc_property_trie +
                      (ulong)(((ushort)cVar6 & 0x1f) +
                             (uint)*(ushort *)
                                    (QUnicodeTables::uc_property_trie +
                                    (ulong)((ushort)cVar6 >> 5) * 2)) * 2) * 0x14 + 0xe) & 1) == 0)
        {
          cVar6 = sVar5 + cVar6;
        }
        else if (*(short *)(QUnicodeTables::specialCaseMap + (long)sVar5 * 2) == 1) {
          cVar6 = *(char16_t *)(QUnicodeTables::specialCaseMap + (long)sVar5 * 2 + 2);
        }
        if (-1 < lVar4) {
          lVar4 = lVar4 * 2;
          do {
            cVar10 = *(char16_t *)((long)&start->ucs + lVar4);
            sVar5 = (short)((uint)(int)(short)*(ushort *)
                                               (QUnicodeTables::uc_properties +
                                               (ulong)*(ushort *)
                                                       (QUnicodeTables::uc_property_trie +
                                                       (ulong)(((ushort)cVar10 & 0x1f) +
                                                              (uint)*(ushort *)
                                                                     (QUnicodeTables::
                                                                      uc_property_trie +
                                                                     (ulong)((ushort)cVar10 >> 5) *
                                                                     2)) * 2) * 0x14 + 0xe) >> 1);
            if ((*(ushort *)
                  (QUnicodeTables::uc_properties +
                  (ulong)*(ushort *)
                          (QUnicodeTables::uc_property_trie +
                          (ulong)(((ushort)cVar10 & 0x1f) +
                                 (uint)*(ushort *)
                                        (QUnicodeTables::uc_property_trie +
                                        (ulong)((ushort)cVar10 >> 5) * 2)) * 2) * 0x14 + 0xe) & 1)
                == 0) {
              cVar10 = sVar5 + cVar10;
            }
            else if (*(short *)(QUnicodeTables::specialCaseMap + (long)sVar5 * 2) == 1) {
              cVar10 = *(char16_t *)(QUnicodeTables::specialCaseMap + (long)sVar5 * 2 + 2);
            }
            if (cVar10 == cVar6) goto LAB_0032803a;
            pQVar8 = (QChar *)((long)&start[-1].ucs + lVar4);
            lVar4 = lVar4 + -2;
          } while (start <= pQVar8);
        }
      }
    }
  }
  else {
    uVar14 = (from >> 0x3f & uVar7) + from;
    if (uVar14 == uVar7 && lVar4 == 0) {
      return uVar7;
    }
    uVar3 = uVar7 - lVar4;
    if (-1 < (long)uVar3 && uVar14 <= uVar7) {
      if ((long)uVar14 < (long)uVar3) {
        uVar3 = uVar14;
      }
      pQVar13 = start + uVar3;
      uVar7 = 0;
      if (lVar4 != 0) {
        uVar7 = lVar4 - 1;
      }
      if (cs == CaseSensitive) {
        if (lVar4 < 1) {
          lVar12 = 0;
          lVar11 = 0;
        }
        else {
          iVar2 = 1;
          if (lVar4 == 0) {
            iVar2 = (int)needle.m_size;
          }
          lVar11 = 0;
          lVar12 = 0;
          lVar9 = lVar4;
          do {
            lVar11 = (ulong)*(ushort *)((long)pQVar8 + (lVar9 * 2 - (ulong)(uint)(iVar2 * 2))) +
                     lVar11 * 2;
            lVar12 = (ulong)*(ushort *)
                             ((long)start + lVar9 * 2 + (uVar3 * 2 - (ulong)(uint)(iVar2 * 2))) +
                     lVar12 * 2;
            lVar9 = lVar9 + -1;
          } while (lVar9 != 0);
        }
        if (-1 < (long)uVar14) {
          lVar12 = lVar12 - (ulong)(ushort)pQVar13->ucs;
          do {
            lVar12 = (ulong)(ushort)pQVar13->ucs + lVar12;
            if (lVar12 == lVar11) {
              if (lVar4 == 0) {
LAB_00328111:
                return (long)pQVar13 - (long)start >> 1;
              }
              lVar9 = 0;
              while (pQVar8[lVar9].ucs == pQVar13[lVar9].ucs) {
                lVar9 = lVar9 + 1;
                if (lVar4 == lVar9) goto LAB_00328111;
              }
            }
            pQVar13 = pQVar13 + -1;
            if (uVar7 < 0x40) {
              lVar12 = lVar12 - ((ulong)(ushort)pQVar13[lVar4].ucs << ((byte)uVar7 & 0x3f));
            }
            lVar12 = lVar12 * 2;
          } while (start <= pQVar13);
        }
      }
      else {
        if (lVar4 < 1) {
          lVar12 = 0;
          lVar11 = 0;
        }
        else {
          ch_00 = pQVar8 + uVar7;
          ch = pQVar13 + uVar7;
          lVar11 = 0;
          lVar12 = 0;
          lVar9 = lVar4;
          do {
            cVar1 = (anonymous_namespace)::foldCaseHelper<QChar_const*>(ch_00,pQVar8);
            lVar11 = (ulong)(uint)cVar1 + lVar11 * 2;
            cVar1 = (anonymous_namespace)::foldCaseHelper<QChar_const*>(ch,start);
            lVar12 = (ulong)(uint)cVar1 + lVar12 * 2;
            ch = ch + -1;
            ch_00 = ch_00 + -1;
            lVar9 = lVar9 + -1;
          } while (lVar9 != 0);
        }
        if (-1 < (long)uVar14) {
          cVar1 = (anonymous_namespace)::foldCaseHelper<QChar_const*>(pQVar13,start);
          lVar12 = lVar12 - (ulong)(uint)cVar1;
          lVar9 = uVar3 * 2;
          do {
            pQVar13 = (QChar *)((long)&start->ucs + lVar9);
            cVar1 = (anonymous_namespace)::foldCaseHelper<QChar_const*>(pQVar13,start);
            lVar12 = (ulong)(uint)cVar1 + lVar12;
            if ((lVar12 == lVar11) &&
               (iVar2 = ucstricmp(lVar4,(char16_t *)pQVar13,lVar4,(char16_t *)pQVar8), iVar2 == 0))
            {
              return lVar9 >> 1;
            }
            if (uVar7 < 0x40) {
              cVar1 = (anonymous_namespace)::foldCaseHelper<QChar_const*>
                                ((QChar *)((long)&start[lVar4 + -1].ucs + lVar9),start);
              lVar12 = lVar12 - ((ulong)(uint)cVar1 << ((byte)uVar7 & 0x3f));
            }
            lVar12 = lVar12 * 2;
            pQVar13 = (QChar *)((long)&start[-1].ucs + lVar9);
            lVar9 = lVar9 + -2;
          } while (start <= pQVar13);
        }
      }
    }
  }
  return -1;
}

Assistant:

qsizetype QtPrivate::lastIndexOf(QStringView haystack, qsizetype from, QStringView needle, Qt::CaseSensitivity cs) noexcept
{
    return qLastIndexOf(haystack, from, needle, cs);
}